

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeTestsUtil.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)24>_> *
vkt::compute::makeCommandPool
          (Move<vk::Handle<(vk::HandleType)24>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,deUint32 queueFamilyIndex)

{
  VkCommandPoolCreateInfo commandPoolParams;
  VkCommandPoolCreateInfo local_20;
  
  local_20.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_20.pNext = (void *)0x0;
  local_20.flags = 2;
  local_20.queueFamilyIndex = queueFamilyIndex;
  ::vk::createCommandPool(__return_storage_ptr__,vk,device,&local_20,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkCommandPool> makeCommandPool (const DeviceInterface& vk, const VkDevice device, const deUint32 queueFamilyIndex)
{
	const VkCommandPoolCreateInfo commandPoolParams =
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,			// VkStructureType			sType;
		DE_NULL,											// const void*				pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,	// VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,									// deUint32					queueFamilyIndex;
	};
	return createCommandPool(vk, device, &commandPoolParams);
}